

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  ulong uVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 (*pauVar35) [16];
  int iVar36;
  AABBNodeMB4D *node1;
  ulong uVar37;
  int *piVar38;
  Scene *pSVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 (*pauVar46) [16];
  undefined4 uVar47;
  ulong unaff_R12;
  long lVar48;
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar59;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar56 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [64];
  float fVar103;
  undefined1 auVar104 [16];
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar105 [64];
  uint uVar109;
  undefined1 auVar110 [16];
  uint uVar112;
  uint uVar113;
  uint uVar114;
  undefined1 auVar111 [64];
  undefined1 auVar115 [16];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  float fVar118;
  float fVar124;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar122;
  float fVar123;
  undefined1 auVar121 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  int local_119c;
  undefined1 local_1198 [16];
  undefined1 local_1188 [16];
  undefined1 local_1178 [16];
  undefined1 local_1168 [16];
  undefined1 local_1158 [16];
  RTCIntersectArguments *local_1140;
  undefined1 local_1138 [16];
  RTCFilterFunctionNArguments local_1128;
  undefined1 local_10f8 [16];
  float local_10e8;
  undefined4 local_10e4;
  undefined4 local_10e0;
  float local_10dc;
  float local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1058 [16];
  float local_1048 [4];
  float local_1038 [4];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      aVar3 = (ray->super_RayK<1>).dir.field_0;
      auVar73 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar60 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar61._8_4_ = 0x7fffffff;
      auVar61._0_8_ = 0x7fffffff7fffffff;
      auVar61._12_4_ = 0x7fffffff;
      auVar61 = vandps_avx((undefined1  [16])aVar3,auVar61);
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar61 = vcmpps_avx(auVar61,auVar94,1);
      auVar61 = vblendvps_avx((undefined1  [16])aVar3,auVar94,auVar61);
      pauVar46 = (undefined1 (*) [16])local_f68;
      auVar94 = vrcpps_avx(auVar61);
      fVar49 = auVar94._0_4_;
      auVar82._0_4_ = auVar61._0_4_ * fVar49;
      fVar57 = auVar94._4_4_;
      auVar82._4_4_ = auVar61._4_4_ * fVar57;
      fVar58 = auVar94._8_4_;
      auVar82._8_4_ = auVar61._8_4_ * fVar58;
      fVar59 = auVar94._12_4_;
      auVar82._12_4_ = auVar61._12_4_ * fVar59;
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = &DAT_3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar61 = vsubps_avx(auVar95,auVar82);
      auVar83._0_4_ = fVar49 + fVar49 * auVar61._0_4_;
      auVar83._4_4_ = fVar57 + fVar57 * auVar61._4_4_;
      auVar83._8_4_ = fVar58 + fVar58 * auVar61._8_4_;
      auVar83._12_4_ = fVar59 + fVar59 * auVar61._12_4_;
      uVar47 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_f88._4_4_ = uVar47;
      local_f88._0_4_ = uVar47;
      local_f88._8_4_ = uVar47;
      local_f88._12_4_ = uVar47;
      auVar102 = ZEXT1664(local_f88);
      uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_f98._4_4_ = uVar47;
      local_f98._0_4_ = uVar47;
      local_f98._8_4_ = uVar47;
      local_f98._12_4_ = uVar47;
      auVar105 = ZEXT1664(local_f98);
      uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_fa8._4_4_ = uVar47;
      local_fa8._0_4_ = uVar47;
      local_fa8._8_4_ = uVar47;
      local_fa8._12_4_ = uVar47;
      auVar111 = ZEXT1664(local_fa8);
      local_fb8 = vshufps_avx(auVar83,auVar83,0);
      auVar116 = ZEXT1664(local_fb8);
      auVar61 = vmovshdup_avx(auVar83);
      local_fc8 = vshufps_avx(auVar83,auVar83,0x55);
      auVar117 = ZEXT1664(local_fc8);
      auVar94 = vshufpd_avx(auVar83,auVar83,1);
      uVar42 = (ulong)(auVar83._0_4_ < 0.0) * 0x10;
      uVar44 = (ulong)(auVar61._0_4_ < 0.0) << 4 | 0x20;
      local_fd8 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar121 = ZEXT1664(local_fd8);
      uVar45 = (ulong)(auVar94._0_4_ < 0.0) << 4 | 0x40;
      local_fe8 = vshufps_avx(auVar73,auVar73,0);
      auVar127 = ZEXT1664(local_fe8);
      auVar61 = vshufps_avx(auVar60,auVar60,0);
      auVar56 = ZEXT1664(auVar61);
      local_10b8 = mm_lookupmask_ps._240_8_;
      uStack_10b0 = mm_lookupmask_ps._248_8_;
      do {
        do {
          do {
            if (pauVar46 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar35 = pauVar46 + -1;
            pauVar46 = pauVar46 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar35 + 8));
          uVar40 = *(ulong *)*pauVar46;
          do {
            if ((uVar40 & 8) == 0) {
              uVar37 = uVar40 & 0xfffffffffffffff0;
              fVar49 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar60._4_4_ = fVar49;
              auVar60._0_4_ = fVar49;
              auVar60._8_4_ = fVar49;
              auVar60._12_4_ = fVar49;
              pfVar2 = (float *)(uVar37 + 0x80 + uVar42);
              pfVar1 = (float *)(uVar37 + 0x20 + uVar42);
              auVar73._0_4_ = fVar49 * *pfVar2 + *pfVar1;
              auVar73._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
              auVar73._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
              auVar73._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
              auVar61 = vsubps_avx(auVar73,auVar102._0_16_);
              auVar74._0_4_ = auVar116._0_4_ * auVar61._0_4_;
              auVar74._4_4_ = auVar116._4_4_ * auVar61._4_4_;
              auVar74._8_4_ = auVar116._8_4_ * auVar61._8_4_;
              auVar74._12_4_ = auVar116._12_4_ * auVar61._12_4_;
              auVar61 = vmaxps_avx(auVar127._0_16_,auVar74);
              pfVar2 = (float *)(uVar37 + 0x80 + uVar44);
              pfVar1 = (float *)(uVar37 + 0x20 + uVar44);
              auVar84._0_4_ = fVar49 * *pfVar2 + *pfVar1;
              auVar84._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
              auVar84._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
              auVar84._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
              auVar73 = vsubps_avx(auVar84,auVar105._0_16_);
              auVar85._0_4_ = auVar117._0_4_ * auVar73._0_4_;
              auVar85._4_4_ = auVar117._4_4_ * auVar73._4_4_;
              auVar85._8_4_ = auVar117._8_4_ * auVar73._8_4_;
              auVar85._12_4_ = auVar117._12_4_ * auVar73._12_4_;
              pfVar2 = (float *)(uVar37 + 0x80 + uVar45);
              pfVar1 = (float *)(uVar37 + 0x20 + uVar45);
              auVar89._0_4_ = fVar49 * *pfVar2 + *pfVar1;
              auVar89._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
              auVar89._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
              auVar89._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
              auVar73 = vsubps_avx(auVar89,auVar111._0_16_);
              auVar90._0_4_ = auVar121._0_4_ * auVar73._0_4_;
              auVar90._4_4_ = auVar121._4_4_ * auVar73._4_4_;
              auVar90._8_4_ = auVar121._8_4_ * auVar73._8_4_;
              auVar90._12_4_ = auVar121._12_4_ * auVar73._12_4_;
              auVar73 = vmaxps_avx(auVar85,auVar90);
              local_10a8 = vmaxps_avx(auVar61,auVar73);
              pfVar2 = (float *)(uVar37 + 0x80 + (uVar42 ^ 0x10));
              pfVar1 = (float *)(uVar37 + 0x20 + (uVar42 ^ 0x10));
              auVar86._0_4_ = fVar49 * *pfVar2 + *pfVar1;
              auVar86._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
              auVar86._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
              auVar86._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
              auVar61 = vsubps_avx(auVar86,auVar102._0_16_);
              auVar87._0_4_ = auVar116._0_4_ * auVar61._0_4_;
              auVar87._4_4_ = auVar116._4_4_ * auVar61._4_4_;
              auVar87._8_4_ = auVar116._8_4_ * auVar61._8_4_;
              auVar87._12_4_ = auVar116._12_4_ * auVar61._12_4_;
              pfVar2 = (float *)(uVar37 + 0x80 + (uVar44 ^ 0x10));
              pfVar1 = (float *)(uVar37 + 0x20 + (uVar44 ^ 0x10));
              auVar91._0_4_ = fVar49 * *pfVar2 + *pfVar1;
              auVar91._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
              auVar91._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
              auVar91._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
              auVar61 = vsubps_avx(auVar91,auVar105._0_16_);
              auVar92._0_4_ = auVar117._0_4_ * auVar61._0_4_;
              auVar92._4_4_ = auVar117._4_4_ * auVar61._4_4_;
              auVar92._8_4_ = auVar117._8_4_ * auVar61._8_4_;
              auVar92._12_4_ = auVar117._12_4_ * auVar61._12_4_;
              pfVar2 = (float *)(uVar37 + 0x80 + (uVar45 ^ 0x10));
              pfVar1 = (float *)(uVar37 + 0x20 + (uVar45 ^ 0x10));
              auVar96._0_4_ = fVar49 * *pfVar2 + *pfVar1;
              auVar96._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
              auVar96._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
              auVar96._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
              auVar61 = vsubps_avx(auVar96,auVar111._0_16_);
              auVar97._0_4_ = auVar121._0_4_ * auVar61._0_4_;
              auVar97._4_4_ = auVar121._4_4_ * auVar61._4_4_;
              auVar97._8_4_ = auVar121._8_4_ * auVar61._8_4_;
              auVar97._12_4_ = auVar121._12_4_ * auVar61._12_4_;
              auVar61 = vminps_avx(auVar92,auVar97);
              auVar73 = vminps_avx(auVar56._0_16_,auVar87);
              auVar61 = vminps_avx(auVar73,auVar61);
              if (((uint)uVar40 & 7) == 6) {
                auVar73 = vcmpps_avx(local_10a8,auVar61,2);
                auVar61 = vcmpps_avx(*(undefined1 (*) [16])(uVar37 + 0xe0),auVar60,2);
                auVar60 = vcmpps_avx(auVar60,*(undefined1 (*) [16])(uVar37 + 0xf0),1);
                auVar61 = vandps_avx(auVar61,auVar60);
                auVar61 = vandps_avx(auVar61,auVar73);
              }
              else {
                auVar61 = vcmpps_avx(local_10a8,auVar61,2);
              }
              auVar61 = vpslld_avx(auVar61,0x1f);
              uVar47 = vmovmskps_avx(auVar61);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar47);
            }
            if ((uVar40 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar36 = 4;
              }
              else {
                uVar37 = uVar40 & 0xfffffffffffffff0;
                lVar48 = 0;
                if (unaff_R12 != 0) {
                  for (; (unaff_R12 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                  }
                }
                iVar36 = 0;
                uVar40 = *(ulong *)(uVar37 + lVar48 * 8);
                uVar43 = unaff_R12 - 1 & unaff_R12;
                if (uVar43 != 0) {
                  uVar109 = *(uint *)(local_10a8 + lVar48 * 4);
                  lVar48 = 0;
                  if (uVar43 != 0) {
                    for (; (uVar43 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                    }
                  }
                  uVar4 = *(ulong *)(uVar37 + lVar48 * 8);
                  uVar112 = *(uint *)(local_10a8 + lVar48 * 4);
                  uVar43 = uVar43 - 1 & uVar43;
                  if (uVar43 == 0) {
                    if (uVar109 < uVar112) {
                      *(ulong *)*pauVar46 = uVar4;
                      *(uint *)(*pauVar46 + 8) = uVar112;
                      pauVar46 = pauVar46 + 1;
                    }
                    else {
                      *(ulong *)*pauVar46 = uVar40;
                      *(uint *)(*pauVar46 + 8) = uVar109;
                      uVar40 = uVar4;
                      pauVar46 = pauVar46 + 1;
                    }
                  }
                  else {
                    auVar62._8_8_ = 0;
                    auVar62._0_8_ = uVar40;
                    auVar61 = vpunpcklqdq_avx(auVar62,ZEXT416(uVar109));
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar4;
                    auVar73 = vpunpcklqdq_avx(auVar75,ZEXT416(uVar112));
                    lVar48 = 0;
                    if (uVar43 != 0) {
                      for (; (uVar43 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                      }
                    }
                    auVar88._8_8_ = 0;
                    auVar88._0_8_ = *(ulong *)(uVar37 + lVar48 * 8);
                    auVar94 = vpunpcklqdq_avx(auVar88,ZEXT416(*(uint *)(local_10a8 + lVar48 * 4)));
                    auVar60 = vpcmpgtd_avx(auVar73,auVar61);
                    uVar43 = uVar43 - 1 & uVar43;
                    if (uVar43 == 0) {
                      auVar82 = vpshufd_avx(auVar60,0xaa);
                      auVar60 = vblendvps_avx(auVar73,auVar61,auVar82);
                      auVar61 = vblendvps_avx(auVar61,auVar73,auVar82);
                      auVar73 = vpcmpgtd_avx(auVar94,auVar60);
                      auVar82 = vpshufd_avx(auVar73,0xaa);
                      auVar73 = vblendvps_avx(auVar94,auVar60,auVar82);
                      auVar60 = vblendvps_avx(auVar60,auVar94,auVar82);
                      auVar94 = vpcmpgtd_avx(auVar60,auVar61);
                      auVar82 = vpshufd_avx(auVar94,0xaa);
                      auVar94 = vblendvps_avx(auVar60,auVar61,auVar82);
                      auVar61 = vblendvps_avx(auVar61,auVar60,auVar82);
                      *pauVar46 = auVar61;
                      pauVar46[1] = auVar94;
                      uVar40 = auVar73._0_8_;
                      pauVar46 = pauVar46 + 2;
                    }
                    else {
                      lVar48 = 0;
                      if (uVar43 != 0) {
                        for (; (uVar43 >> lVar48 & 1) == 0; lVar48 = lVar48 + 1) {
                        }
                      }
                      auVar98._8_8_ = 0;
                      auVar98._0_8_ = *(ulong *)(uVar37 + lVar48 * 8);
                      auVar83 = vpunpcklqdq_avx(auVar98,ZEXT416(*(uint *)(local_10a8 + lVar48 * 4)))
                      ;
                      auVar82 = vpshufd_avx(auVar60,0xaa);
                      auVar60 = vblendvps_avx(auVar73,auVar61,auVar82);
                      auVar61 = vblendvps_avx(auVar61,auVar73,auVar82);
                      auVar73 = vpcmpgtd_avx(auVar83,auVar94);
                      auVar82 = vpshufd_avx(auVar73,0xaa);
                      auVar73 = vblendvps_avx(auVar83,auVar94,auVar82);
                      auVar94 = vblendvps_avx(auVar94,auVar83,auVar82);
                      auVar82 = vpcmpgtd_avx(auVar94,auVar61);
                      auVar83 = vpshufd_avx(auVar82,0xaa);
                      auVar82 = vblendvps_avx(auVar94,auVar61,auVar83);
                      auVar61 = vblendvps_avx(auVar61,auVar94,auVar83);
                      auVar94 = vpcmpgtd_avx(auVar73,auVar60);
                      auVar83 = vpshufd_avx(auVar94,0xaa);
                      auVar94 = vblendvps_avx(auVar73,auVar60,auVar83);
                      auVar73 = vblendvps_avx(auVar60,auVar73,auVar83);
                      auVar60 = vpcmpgtd_avx(auVar82,auVar73);
                      auVar83 = vpshufd_avx(auVar60,0xaa);
                      auVar60 = vblendvps_avx(auVar82,auVar73,auVar83);
                      auVar73 = vblendvps_avx(auVar73,auVar82,auVar83);
                      *pauVar46 = auVar61;
                      pauVar46[1] = auVar73;
                      pauVar46[2] = auVar60;
                      uVar40 = auVar94._0_8_;
                      pauVar46 = pauVar46 + 3;
                    }
                  }
                }
              }
            }
            else {
              iVar36 = 6;
            }
          } while (iVar36 == 0);
        } while (iVar36 != 6);
        uVar37 = (ulong)((uint)uVar40 & 0xf);
        if (uVar37 != 8) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          lVar48 = 0;
          do {
            lVar41 = lVar48 * 0x140;
            fVar49 = (ray->super_RayK<1>).dir.field_0.m128[3];
            pfVar2 = (float *)(uVar40 + 0x90 + lVar41);
            pfVar1 = (float *)(uVar40 + lVar41);
            auVar101._0_4_ = fVar49 * *pfVar2 + *pfVar1;
            auVar101._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar101._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
            auVar101._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xa0 + lVar41);
            pfVar1 = (float *)(uVar40 + 0x10 + lVar41);
            auVar99._0_4_ = fVar49 * *pfVar2 + *pfVar1;
            auVar99._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar99._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
            auVar99._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xb0 + lVar41);
            pfVar1 = (float *)(uVar40 + 0x20 + lVar41);
            auVar100._0_4_ = fVar49 * *pfVar2 + *pfVar1;
            auVar100._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar100._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
            auVar100._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xc0 + lVar41);
            pfVar1 = (float *)(uVar40 + 0x30 + lVar41);
            auVar63._0_4_ = fVar49 * *pfVar2 + *pfVar1;
            auVar63._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar63._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
            auVar63._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xd0 + lVar41);
            pfVar1 = (float *)(uVar40 + 0x40 + lVar41);
            auVar76._0_4_ = fVar49 * *pfVar2 + *pfVar1;
            auVar76._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar76._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
            auVar76._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xe0 + lVar41);
            pfVar1 = (float *)(uVar40 + 0x50 + lVar41);
            auVar104._0_4_ = fVar49 * *pfVar2 + *pfVar1;
            auVar104._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar104._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
            auVar104._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xf0 + lVar41);
            pfVar1 = (float *)(uVar40 + 0x60 + lVar41);
            auVar110._0_4_ = fVar49 * *pfVar2 + *pfVar1;
            auVar110._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar110._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
            auVar110._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0x100 + lVar41);
            pfVar1 = (float *)(uVar40 + 0x70 + lVar41);
            auVar115._0_4_ = fVar49 * *pfVar2 + *pfVar1;
            auVar115._4_4_ = fVar49 * pfVar2[1] + pfVar1[1];
            auVar115._8_4_ = fVar49 * pfVar2[2] + pfVar1[2];
            auVar115._12_4_ = fVar49 * pfVar2[3] + pfVar1[3];
            pfVar1 = (float *)(uVar40 + 0x110 + lVar41);
            pfVar2 = (float *)(uVar40 + 0x80 + lVar41);
            auVar50._0_4_ = fVar49 * *pfVar1 + *pfVar2;
            auVar50._4_4_ = fVar49 * pfVar1[1] + pfVar2[1];
            auVar50._8_4_ = fVar49 * pfVar1[2] + pfVar2[2];
            auVar50._12_4_ = fVar49 * pfVar1[3] + pfVar2[3];
            local_1168 = vsubps_avx(auVar101,auVar63);
            local_1198 = vsubps_avx(auVar99,auVar76);
            auVar61 = vsubps_avx(auVar100,auVar104);
            auVar73 = vsubps_avx(auVar110,auVar101);
            auVar60 = vsubps_avx(auVar115,auVar99);
            auVar94 = vsubps_avx(auVar50,auVar100);
            fVar59 = auVar94._0_4_;
            fVar118 = local_1198._0_4_;
            auVar51._0_4_ = fVar118 * fVar59;
            fVar12 = auVar94._4_4_;
            fVar122 = local_1198._4_4_;
            auVar51._4_4_ = fVar122 * fVar12;
            fVar19 = auVar94._8_4_;
            fVar123 = local_1198._8_4_;
            auVar51._8_4_ = fVar123 * fVar19;
            fVar26 = auVar94._12_4_;
            fVar124 = local_1198._12_4_;
            auVar51._12_4_ = fVar124 * fVar26;
            fVar93 = auVar60._0_4_;
            fVar103 = auVar61._0_4_;
            auVar64._0_4_ = fVar103 * fVar93;
            fVar13 = auVar60._4_4_;
            fVar106 = auVar61._4_4_;
            auVar64._4_4_ = fVar106 * fVar13;
            fVar20 = auVar60._8_4_;
            fVar107 = auVar61._8_4_;
            auVar64._8_4_ = fVar107 * fVar20;
            fVar27 = auVar60._12_4_;
            fVar108 = auVar61._12_4_;
            auVar64._12_4_ = fVar108 * fVar27;
            local_1178 = vsubps_avx(auVar64,auVar51);
            fVar7 = auVar73._0_4_;
            auVar65._0_4_ = fVar103 * fVar7;
            fVar14 = auVar73._4_4_;
            auVar65._4_4_ = fVar106 * fVar14;
            fVar21 = auVar73._8_4_;
            auVar65._8_4_ = fVar107 * fVar21;
            fVar28 = auVar73._12_4_;
            auVar65._12_4_ = fVar108 * fVar28;
            fVar8 = local_1168._0_4_;
            auVar77._0_4_ = fVar59 * fVar8;
            fVar15 = local_1168._4_4_;
            auVar77._4_4_ = fVar12 * fVar15;
            fVar22 = local_1168._8_4_;
            auVar77._8_4_ = fVar19 * fVar22;
            fVar29 = local_1168._12_4_;
            auVar77._12_4_ = fVar26 * fVar29;
            local_1008 = vsubps_avx(auVar77,auVar65);
            auVar78._0_4_ = fVar93 * fVar8;
            auVar78._4_4_ = fVar13 * fVar15;
            auVar78._8_4_ = fVar20 * fVar22;
            auVar78._12_4_ = fVar27 * fVar29;
            auVar119._0_4_ = fVar118 * fVar7;
            auVar119._4_4_ = fVar122 * fVar14;
            auVar119._8_4_ = fVar123 * fVar21;
            auVar119._12_4_ = fVar124 * fVar28;
            local_1138 = vsubps_avx(auVar119,auVar78);
            uVar47 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar120._4_4_ = uVar47;
            auVar120._0_4_ = uVar47;
            auVar120._8_4_ = uVar47;
            auVar120._12_4_ = uVar47;
            uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar125._4_4_ = uVar47;
            auVar125._0_4_ = uVar47;
            auVar125._8_4_ = uVar47;
            auVar125._12_4_ = uVar47;
            uVar47 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar128._4_4_ = uVar47;
            auVar128._0_4_ = uVar47;
            auVar128._8_4_ = uVar47;
            auVar128._12_4_ = uVar47;
            fVar49 = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_1188 = vsubps_avx(auVar101,auVar120);
            fVar57 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar61 = vsubps_avx(auVar99,auVar125);
            auVar73 = vsubps_avx(auVar100,auVar128);
            fVar9 = auVar73._0_4_;
            auVar126._0_4_ = fVar49 * fVar9;
            fVar16 = auVar73._4_4_;
            auVar126._4_4_ = fVar49 * fVar16;
            fVar23 = auVar73._8_4_;
            auVar126._8_4_ = fVar49 * fVar23;
            fVar30 = auVar73._12_4_;
            auVar126._12_4_ = fVar49 * fVar30;
            fVar10 = auVar61._0_4_;
            auVar129._0_4_ = fVar57 * fVar10;
            fVar17 = auVar61._4_4_;
            auVar129._4_4_ = fVar57 * fVar17;
            fVar24 = auVar61._8_4_;
            auVar129._8_4_ = fVar57 * fVar24;
            fVar31 = auVar61._12_4_;
            auVar129._12_4_ = fVar57 * fVar31;
            auVar73 = vsubps_avx(auVar129,auVar126);
            fVar58 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fVar11 = local_1188._0_4_;
            auVar52._0_4_ = fVar57 * fVar11;
            fVar18 = local_1188._4_4_;
            auVar52._4_4_ = fVar57 * fVar18;
            fVar25 = local_1188._8_4_;
            auVar52._8_4_ = fVar57 * fVar25;
            fVar32 = local_1188._12_4_;
            auVar52._12_4_ = fVar57 * fVar32;
            auVar66._0_4_ = fVar58 * fVar9;
            auVar66._4_4_ = fVar58 * fVar16;
            auVar66._8_4_ = fVar58 * fVar23;
            auVar66._12_4_ = fVar58 * fVar30;
            auVar60 = vsubps_avx(auVar66,auVar52);
            auVar67._0_4_ = fVar58 * fVar10;
            auVar67._4_4_ = fVar58 * fVar17;
            auVar67._8_4_ = fVar58 * fVar24;
            auVar67._12_4_ = fVar58 * fVar31;
            auVar79._0_4_ = fVar49 * fVar11;
            auVar79._4_4_ = fVar49 * fVar18;
            auVar79._8_4_ = fVar49 * fVar25;
            auVar79._12_4_ = fVar49 * fVar32;
            auVar94 = vsubps_avx(auVar79,auVar67);
            auVar80._0_4_ =
                 fVar58 * local_1178._0_4_ + fVar49 * local_1008._0_4_ + fVar57 * local_1138._0_4_;
            auVar80._4_4_ =
                 fVar58 * local_1178._4_4_ + fVar49 * local_1008._4_4_ + fVar57 * local_1138._4_4_;
            auVar80._8_4_ =
                 fVar58 * local_1178._8_4_ + fVar49 * local_1008._8_4_ + fVar57 * local_1138._8_4_;
            auVar80._12_4_ =
                 fVar58 * local_1178._12_4_ +
                 fVar49 * local_1008._12_4_ + fVar57 * local_1138._12_4_;
            auVar68._8_8_ = 0x8000000080000000;
            auVar68._0_8_ = 0x8000000080000000;
            auVar61 = vandps_avx(auVar80,auVar68);
            uVar109 = auVar61._0_4_;
            local_10a8._0_4_ =
                 (float)(uVar109 ^
                        (uint)(fVar7 * auVar73._0_4_ +
                              fVar93 * auVar60._0_4_ + fVar59 * auVar94._0_4_));
            uVar112 = auVar61._4_4_;
            local_10a8._4_4_ =
                 (float)(uVar112 ^
                        (uint)(fVar14 * auVar73._4_4_ +
                              fVar13 * auVar60._4_4_ + fVar12 * auVar94._4_4_));
            uVar113 = auVar61._8_4_;
            local_10a8._8_4_ =
                 (float)(uVar113 ^
                        (uint)(fVar21 * auVar73._8_4_ +
                              fVar20 * auVar60._8_4_ + fVar19 * auVar94._8_4_));
            uVar114 = auVar61._12_4_;
            local_10a8._12_4_ =
                 (float)(uVar114 ^
                        (uint)(fVar28 * auVar73._12_4_ +
                              fVar27 * auVar60._12_4_ + fVar26 * auVar94._12_4_));
            local_1098._0_4_ =
                 (float)(uVar109 ^
                        (uint)(auVar73._0_4_ * fVar8 +
                              auVar60._0_4_ * fVar118 + fVar103 * auVar94._0_4_));
            local_1098._4_4_ =
                 (float)(uVar112 ^
                        (uint)(auVar73._4_4_ * fVar15 +
                              auVar60._4_4_ * fVar122 + fVar106 * auVar94._4_4_));
            local_1098._8_4_ =
                 (float)(uVar113 ^
                        (uint)(auVar73._8_4_ * fVar22 +
                              auVar60._8_4_ * fVar123 + fVar107 * auVar94._8_4_));
            local_1098._12_4_ =
                 (float)(uVar114 ^
                        (uint)(auVar73._12_4_ * fVar29 +
                              auVar60._12_4_ * fVar124 + fVar108 * auVar94._12_4_));
            auVar60 = ZEXT416(0) << 0x20;
            auVar61 = vcmpps_avx(local_10a8,auVar60,5);
            auVar73 = vcmpps_avx(local_1098,auVar60,5);
            auVar61 = vandps_avx(auVar61,auVar73);
            auVar69._8_4_ = 0x7fffffff;
            auVar69._0_8_ = 0x7fffffff7fffffff;
            auVar69._12_4_ = 0x7fffffff;
            local_1078 = vandps_avx(auVar80,auVar69);
            auVar73 = vcmpps_avx(auVar60,auVar80,4);
            auVar61 = vandps_avx(auVar61,auVar73);
            auVar70._0_4_ = local_1098._0_4_ + local_10a8._0_4_;
            auVar70._4_4_ = local_1098._4_4_ + local_10a8._4_4_;
            auVar70._8_4_ = local_1098._8_4_ + local_10a8._8_4_;
            auVar70._12_4_ = local_1098._12_4_ + local_10a8._12_4_;
            auVar73 = vcmpps_avx(auVar70,local_1078,2);
            auVar61 = vandps_avx(auVar61,auVar73);
            auVar33._8_8_ = uStack_10b0;
            auVar33._0_8_ = local_10b8;
            auVar33 = auVar33 & auVar61;
            if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar33[0xf] < '\0') {
              auVar34._8_8_ = uStack_10b0;
              auVar34._0_8_ = local_10b8;
              auVar61 = vandps_avx(auVar61,auVar34);
              local_1088._0_4_ =
                   (float)(uVar109 ^
                          (uint)(local_1178._0_4_ * fVar11 +
                                local_1008._0_4_ * fVar10 + fVar9 * local_1138._0_4_));
              local_1088._4_4_ =
                   (float)(uVar112 ^
                          (uint)(local_1178._4_4_ * fVar18 +
                                local_1008._4_4_ * fVar17 + fVar16 * local_1138._4_4_));
              local_1088._8_4_ =
                   (float)(uVar113 ^
                          (uint)(local_1178._8_4_ * fVar25 +
                                local_1008._8_4_ * fVar24 + fVar23 * local_1138._8_4_));
              local_1088._12_4_ =
                   (float)(uVar114 ^
                          (uint)(local_1178._12_4_ * fVar32 +
                                local_1008._12_4_ * fVar31 + fVar30 * local_1138._12_4_));
              fVar49 = (ray->super_RayK<1>).org.field_0.m128[3];
              fVar57 = local_1078._0_4_;
              auVar53._0_4_ = fVar57 * fVar49;
              fVar58 = local_1078._4_4_;
              auVar53._4_4_ = fVar58 * fVar49;
              fVar59 = local_1078._8_4_;
              auVar53._8_4_ = fVar59 * fVar49;
              fVar93 = local_1078._12_4_;
              auVar53._12_4_ = fVar93 * fVar49;
              auVar73 = vcmpps_avx(auVar53,local_1088,1);
              fVar49 = (ray->super_RayK<1>).tfar;
              auVar71._0_4_ = fVar57 * fVar49;
              auVar71._4_4_ = fVar58 * fVar49;
              auVar71._8_4_ = fVar59 * fVar49;
              auVar71._12_4_ = fVar93 * fVar49;
              auVar60 = vcmpps_avx(local_1088,auVar71,2);
              auVar73 = vandps_avx(auVar60,auVar73);
              auVar60 = auVar61 & auVar73;
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar60[0xf] < '\0') {
                auVar61 = vandps_avx(auVar61,auVar73);
                local_1058 = auVar61;
                local_1018 = local_1178;
                local_ff8 = local_1138._0_8_;
                uStack_ff0 = local_1138._8_8_;
                auVar73 = vrcpps_avx(local_1078);
                fVar49 = auVar73._0_4_;
                auVar72._0_4_ = fVar57 * fVar49;
                fVar57 = auVar73._4_4_;
                auVar72._4_4_ = fVar58 * fVar57;
                fVar58 = auVar73._8_4_;
                auVar72._8_4_ = fVar59 * fVar58;
                fVar59 = auVar73._12_4_;
                auVar72._12_4_ = fVar93 * fVar59;
                auVar81._8_4_ = 0x3f800000;
                auVar81._0_8_ = &DAT_3f8000003f800000;
                auVar81._12_4_ = 0x3f800000;
                auVar73 = vsubps_avx(auVar81,auVar72);
                fVar49 = fVar49 + fVar49 * auVar73._0_4_;
                fVar57 = fVar57 + fVar57 * auVar73._4_4_;
                fVar58 = fVar58 + fVar58 * auVar73._8_4_;
                fVar59 = fVar59 + fVar59 * auVar73._12_4_;
                local_1028._0_4_ = fVar49 * local_1088._0_4_;
                local_1028._4_4_ = fVar57 * local_1088._4_4_;
                local_1028._8_4_ = fVar58 * local_1088._8_4_;
                local_1028._12_4_ = fVar59 * local_1088._12_4_;
                local_1158 = auVar61;
                local_1048[0] = fVar49 * local_10a8._0_4_;
                local_1048[1] = fVar57 * local_10a8._4_4_;
                local_1048[2] = fVar58 * local_10a8._8_4_;
                local_1048[3] = fVar59 * local_10a8._12_4_;
                local_1038[0] = fVar49 * local_1098._0_4_;
                local_1038[1] = fVar57 * local_1098._4_4_;
                local_1038[2] = fVar58 * local_1098._8_4_;
                local_1038[3] = fVar59 * local_1098._12_4_;
                auVar54._8_4_ = 0x7f800000;
                auVar54._0_8_ = 0x7f8000007f800000;
                auVar54._12_4_ = 0x7f800000;
                auVar73 = vblendvps_avx(auVar54,local_1028,auVar61);
                auVar60 = vshufps_avx(auVar73,auVar73,0xb1);
                auVar60 = vminps_avx(auVar60,auVar73);
                auVar94 = vshufpd_avx(auVar60,auVar60,1);
                auVar60 = vminps_avx(auVar94,auVar60);
                auVar73 = vcmpps_avx(auVar73,auVar60,0);
                auVar60 = auVar61 & auVar73;
                if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar60[0xf] < '\0') {
                  auVar61 = vandps_avx(auVar73,auVar61);
                }
                lVar41 = lVar41 + uVar40;
                uVar47 = vmovmskps_avx(auVar61);
                uVar43 = CONCAT44((int)((ulong)context >> 0x20),uVar47);
                piVar38 = (int *)0x0;
                if (uVar43 != 0) {
                  for (; (uVar43 >> (long)piVar38 & 1) == 0; piVar38 = (int *)((long)piVar38 + 1)) {
                  }
                }
                local_1138._0_8_ = context->scene;
                pSVar39 = context->scene;
                auVar61 = local_1028;
                do {
                  uVar109 = *(uint *)(lVar41 + 0x120 + (long)piVar38 * 4);
                  local_1198._0_8_ = CONCAT44(0,uVar109);
                  pGVar5 = (pSVar39->geometries).items[CONCAT44(0,uVar109)].ptr;
                  local_1168._0_8_ = pGVar5;
                  if ((pGVar5->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_1158 + (long)piVar38 * 4) = 0;
                    local_10f8 = auVar61;
                  }
                  else {
                    local_1178._0_8_ = piVar38;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar49 = local_1048[(long)piVar38];
                      fVar57 = local_1038[(long)piVar38];
                      (ray->super_RayK<1>).tfar = *(float *)(local_1028 + (long)piVar38 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_1018 + (long)piVar38 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_1008 + (long)piVar38 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)((long)&local_ff8 + (long)piVar38 * 4)
                      ;
                      ray->u = fVar49;
                      ray->v = fVar57;
                      ray->primID = *(uint *)(lVar41 + 0x130 + (long)piVar38 * 4);
                      ray->geomID = uVar109;
                      pRVar6 = context->user;
                      ray->instID[0] = pRVar6->instID[0];
                      ray->instPrimID[0] = pRVar6->instPrimID[0];
                      break;
                    }
                    local_1140 = context->args;
                    local_10f8 = auVar61;
                    local_1188._0_8_ = pauVar46;
                    local_1128.context = context->user;
                    local_10e8 = *(float *)(local_1018 + (long)piVar38 * 4);
                    local_10e4 = *(undefined4 *)(local_1008 + (long)piVar38 * 4);
                    local_10e0 = *(undefined4 *)((long)&local_ff8 + (long)piVar38 * 4);
                    local_10dc = local_1048[(long)piVar38];
                    local_10d8 = local_1038[(long)piVar38];
                    local_10d4 = *(undefined4 *)(lVar41 + 0x130 + (long)piVar38 * 4);
                    local_10d0 = uVar109;
                    local_10cc = (local_1128.context)->instID[0];
                    local_10c8 = (local_1128.context)->instPrimID[0];
                    local_1198._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_1028 + (long)piVar38 * 4);
                    local_119c = -1;
                    local_1128.valid = &local_119c;
                    local_1128.geometryUserPtr = pGVar5->userPtr;
                    local_1128.ray = (RTCRayN *)ray;
                    local_1128.hit = (RTCHitN *)&local_10e8;
                    local_1128.N = 1;
                    if ((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar5->intersectionFilterN)(&local_1128), *local_1128.valid != 0)) {
                      if (local_1140->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_1140->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           ((*(byte *)(local_1168._0_8_ + 0x3e) & 0x40) != 0)) {
                          (*local_1140->filter)(&local_1128);
                        }
                        if (*local_1128.valid == 0) goto LAB_012b1c44;
                      }
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1128.hit;
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1128.hit + 4);
                      (((Vec3f *)((long)local_1128.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1128.hit + 8);
                      *(float *)((long)local_1128.ray + 0x3c) = *(float *)(local_1128.hit + 0xc);
                      *(float *)((long)local_1128.ray + 0x40) = *(float *)(local_1128.hit + 0x10);
                      *(float *)((long)local_1128.ray + 0x44) = *(float *)(local_1128.hit + 0x14);
                      *(float *)((long)local_1128.ray + 0x48) = *(float *)(local_1128.hit + 0x18);
                      *(float *)((long)local_1128.ray + 0x4c) = *(float *)(local_1128.hit + 0x1c);
                      *(float *)((long)local_1128.ray + 0x50) = *(float *)(local_1128.hit + 0x20);
                    }
                    else {
LAB_012b1c44:
                      (ray->super_RayK<1>).tfar = (float)local_1198._0_4_;
                    }
                    *(undefined4 *)(local_1158 + local_1178._0_8_ * 4) = 0;
                    fVar49 = (ray->super_RayK<1>).tfar;
                    auVar55._4_4_ = fVar49;
                    auVar55._0_4_ = fVar49;
                    auVar55._8_4_ = fVar49;
                    auVar55._12_4_ = fVar49;
                    auVar61 = vcmpps_avx(local_10f8,auVar55,2);
                    local_1158 = vandps_avx(auVar61,local_1158);
                    pauVar46 = (undefined1 (*) [16])local_1188._0_8_;
                  }
                  if ((((local_1158 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1158 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1158 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1158[0xf]) break;
                  local_1188._0_8_ = pauVar46;
                  BVHNIntersector1<4,16777232,false,embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,true>>>
                  ::intersect(&local_1128);
                  piVar38 = local_1128.valid;
                  pSVar39 = (Scene *)local_1138._0_8_;
                  pauVar46 = (undefined1 (*) [16])local_1188._0_8_;
                  auVar61 = local_10f8;
                } while( true );
              }
            }
            lVar48 = lVar48 + 1;
          } while (lVar48 != uVar37 - 8);
        }
        fVar49 = (ray->super_RayK<1>).tfar;
        auVar56 = ZEXT1664(CONCAT412(fVar49,CONCAT48(fVar49,CONCAT44(fVar49,fVar49))));
        auVar102 = ZEXT1664(local_f88);
        auVar105 = ZEXT1664(local_f98);
        auVar111 = ZEXT1664(local_fa8);
        auVar116 = ZEXT1664(local_fb8);
        auVar117 = ZEXT1664(local_fc8);
        auVar121 = ZEXT1664(local_fd8);
        auVar127 = ZEXT1664(local_fe8);
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }